

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprocess.c
# Opt level: O1

pboolean p_process_is_running(puint32 pid)

{
  int iVar1;
  
  iVar1 = kill(pid,0);
  return (pboolean)(iVar1 == 0);
}

Assistant:

P_LIB_API pboolean
p_process_is_running (puint32 pid)
{
#ifdef P_OS_WIN
	HANDLE proc;
	DWORD ret;

	if ((proc = OpenProcess (SYNCHRONIZE, FALSE, pid)) == NULL)
		return FALSE;

	ret = WaitForSingleObject (proc, 0);
	CloseHandle (proc);

	return ret == WAIT_TIMEOUT;
#else
	return kill ((pid_t) pid, 0) == 0;
#endif
}